

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_count(int n,mpc_fold_t f,mpc_parser_t *a,mpc_dtor_t da)

{
  mpc_parser_t *pmVar1;
  char *in_RCX;
  void *in_RDX;
  void *in_RSI;
  int in_EDI;
  mpc_parser_t *p;
  
  pmVar1 = mpc_undefined();
  pmVar1->type = '\x16';
  (pmVar1->data).repeat.n = in_EDI;
  (pmVar1->data).lift.x = in_RSI;
  (pmVar1->data).apply_to.d = in_RDX;
  (pmVar1->data).check.e = in_RCX;
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_count(int n, mpc_fold_t f, mpc_parser_t *a, mpc_dtor_t da) {
  mpc_parser_t *p = mpc_undefined();
  p->type = MPC_TYPE_COUNT;
  p->data.repeat.n = n;
  p->data.repeat.f = f;
  p->data.repeat.x = a;
  p->data.repeat.dx = da;
  return p;
}